

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_GetImportMeta(JSContext *ctx,JSModuleDef *m)

{
  JSValue v;
  int iVar1;
  long in_RSI;
  JSContext *in_RDI;
  JSValue JVar2;
  JSValue obj;
  ulong in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb4;
  JSValueUnion local_40;
  int64_t local_38;
  JSValueUnion local_30;
  int64_t local_28;
  JSValueUnion local_10;
  int64_t local_8;
  
  local_30 = (JSValueUnion)((JSValueUnion *)(in_RSI + 0x98))->ptr;
  local_28 = *(int64_t *)(in_RSI + 0xa0);
  iVar1 = JS_IsUndefined(*(JSValue *)(in_RSI + 0x98));
  if (iVar1 != 0) {
    JVar2.tag._0_4_ = 0;
    JVar2.u = (JSValueUnion)in_stack_ffffffffffffffa8;
    JVar2.tag._4_4_ = in_stack_ffffffffffffffb4;
    JVar2 = JS_NewObjectProto((JSContext *)0x1435e8,JVar2);
    local_40 = JVar2.u;
    local_30 = local_40;
    local_38 = JVar2.tag;
    local_28 = local_38;
    iVar1 = JS_IsException(JVar2);
    if (iVar1 != 0) {
      local_10.ptr = (void *)(local_10 << 0x20);
      local_8 = 6;
      return _local_10;
    }
    ((JSValueUnion *)(in_RSI + 0x98))->ptr = (void *)local_40;
    *(int64_t *)(in_RSI + 0xa0) = local_38;
  }
  v.tag = local_28;
  v.u.float64 = local_30.float64;
  JVar2 = JS_DupValue(in_RDI,v);
  return JVar2;
}

Assistant:

JSValue JS_GetImportMeta(JSContext *ctx, JSModuleDef *m)
{
    JSValue obj;
    /* allocate meta_obj only if requested to save memory */
    obj = m->meta_obj;
    if (JS_IsUndefined(obj)) {
        obj = JS_NewObjectProto(ctx, JS_NULL);
        if (JS_IsException(obj))
            return JS_EXCEPTION;
        m->meta_obj = obj;
    }
    return JS_DupValue(ctx, obj);
}